

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError ValidateOpenStreamParameters
                  (PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *streamCallback,PaUtilHostApiRepresentation **hostApi,
                  PaDeviceIndex *hostApiInputDevice,PaDeviceIndex *hostApiOutputDevice)

{
  int iVar1;
  int local_50;
  int local_4c;
  int outputHostApiIndex;
  int inputHostApiIndex;
  PaUtilHostApiRepresentation **hostApi_local;
  PaStreamCallback *streamCallback_local;
  PaStreamFlags streamFlags_local;
  unsigned_long framesPerBuffer_local;
  double sampleRate_local;
  PaStreamParameters *outputParameters_local;
  PaStreamParameters *inputParameters_local;
  
  local_4c = -1;
  local_50 = -1;
  if ((inputParameters == (PaStreamParameters *)0x0) &&
     (outputParameters == (PaStreamParameters *)0x0)) {
    return -0x270c;
  }
  if (inputParameters == (PaStreamParameters *)0x0) {
    *hostApiInputDevice = -1;
  }
  else if (inputParameters->device == -2) {
    if (inputParameters->hostApiSpecificStreamInfo == (void *)0x0) {
      return -0x270c;
    }
    local_4c = Pa_HostApiTypeIdToHostApiIndex
                         (*(PaHostApiTypeId *)((long)inputParameters->hostApiSpecificStreamInfo + 8)
                         );
    if (local_4c == -1) {
      return -0x270c;
    }
    *hostApiInputDevice = -2;
    *hostApi = hostApis_[local_4c];
  }
  else {
    if ((inputParameters->device < 0) || (deviceCount_ <= inputParameters->device)) {
      return -0x270c;
    }
    local_4c = FindHostApi(inputParameters->device,hostApiInputDevice);
    if (local_4c < 0) {
      return -0x2702;
    }
    *hostApi = hostApis_[local_4c];
    if (inputParameters->channelCount < 1) {
      return -0x270e;
    }
    iVar1 = SampleFormatIsValid(inputParameters->sampleFormat);
    if (iVar1 == 0) {
      return -0x270a;
    }
    if ((inputParameters->hostApiSpecificStreamInfo != (void *)0x0) &&
       (*(PaHostApiTypeId *)((long)inputParameters->hostApiSpecificStreamInfo + 8) !=
        ((*hostApi)->info).type)) {
      return -0x2700;
    }
  }
  if (outputParameters == (PaStreamParameters *)0x0) {
    *hostApiOutputDevice = -1;
  }
  else if (outputParameters->device == -2) {
    if (outputParameters->hostApiSpecificStreamInfo == (void *)0x0) {
      return -0x270c;
    }
    local_50 = Pa_HostApiTypeIdToHostApiIndex
                         (*(PaHostApiTypeId *)
                           ((long)outputParameters->hostApiSpecificStreamInfo + 8));
    if (local_50 == -1) {
      return -0x270c;
    }
    *hostApiOutputDevice = -2;
    *hostApi = hostApis_[local_50];
  }
  else {
    if ((outputParameters->device < 0) || (deviceCount_ <= outputParameters->device)) {
      return -0x270c;
    }
    local_50 = FindHostApi(outputParameters->device,hostApiOutputDevice);
    if (local_50 < 0) {
      return -0x2702;
    }
    *hostApi = hostApis_[local_50];
    if (outputParameters->channelCount < 1) {
      return -0x270e;
    }
    iVar1 = SampleFormatIsValid(outputParameters->sampleFormat);
    if (iVar1 == 0) {
      return -0x270a;
    }
    if ((outputParameters->hostApiSpecificStreamInfo != (void *)0x0) &&
       (*(PaHostApiTypeId *)((long)outputParameters->hostApiSpecificStreamInfo + 8) !=
        ((*hostApi)->info).type)) {
      return -0x2700;
    }
  }
  if (((inputParameters == (PaStreamParameters *)0x0) ||
      (outputParameters == (PaStreamParameters *)0x0)) || (local_4c == local_50)) {
    if ((sampleRate < 1000.0) || (384000.0 < sampleRate)) {
      inputParameters_local._4_4_ = -0x270d;
    }
    else if ((streamFlags & 0xffffffff0000fff0) == 0) {
      if ((streamFlags & 4) != 0) {
        if (streamCallback == (PaStreamCallback *)0x0) {
          return -0x270b;
        }
        if ((inputParameters == (PaStreamParameters *)0x0) ||
           (outputParameters == (PaStreamParameters *)0x0)) {
          return -0x270b;
        }
        if (framesPerBuffer != 0) {
          return -0x270b;
        }
      }
      inputParameters_local._4_4_ = 0;
    }
    else {
      inputParameters_local._4_4_ = -0x270b;
    }
  }
  else {
    inputParameters_local._4_4_ = -0x2709;
  }
  return inputParameters_local._4_4_;
}

Assistant:

static PaError ValidateOpenStreamParameters(
    const PaStreamParameters *inputParameters,
    const PaStreamParameters *outputParameters,
    double sampleRate,
    unsigned long framesPerBuffer,
    PaStreamFlags streamFlags,
    PaStreamCallback *streamCallback,
    PaUtilHostApiRepresentation **hostApi,
    PaDeviceIndex *hostApiInputDevice,
    PaDeviceIndex *hostApiOutputDevice )
{
    int inputHostApiIndex  = -1, /* Surpress uninitialised var warnings: compiler does */
        outputHostApiIndex = -1; /* not see that if inputParameters and outputParame-  */
                                 /* ters are both nonzero, these indices are set.      */

    if( (inputParameters == NULL) && (outputParameters == NULL) )
    {
        return paInvalidDevice; /** @todo should be a new error code "invalid device parameters" or something */
    }
    else
    {
        if( inputParameters == NULL )
        {
            *hostApiInputDevice = paNoDevice;
        }
        else if( inputParameters->device == paUseHostApiSpecificDeviceSpecification )
        {
            if( inputParameters->hostApiSpecificStreamInfo )
            {
                inputHostApiIndex = Pa_HostApiTypeIdToHostApiIndex(
                        ((PaUtilHostApiSpecificStreamInfoHeader*)inputParameters->hostApiSpecificStreamInfo)->hostApiType );

                if( inputHostApiIndex != -1 )
                {
                    *hostApiInputDevice = paUseHostApiSpecificDeviceSpecification;
                    *hostApi = hostApis_[inputHostApiIndex];
                }
                else
                {
                    return paInvalidDevice;
                }
            }
            else
            {
                return paInvalidDevice;
            }
        }
        else
        {
            if( inputParameters->device < 0 || inputParameters->device >= deviceCount_ )
                return paInvalidDevice;

            inputHostApiIndex = FindHostApi( inputParameters->device, hostApiInputDevice );
            if( inputHostApiIndex < 0 )
                return paInternalError;

            *hostApi = hostApis_[inputHostApiIndex];

            if( inputParameters->channelCount <= 0 )
                return paInvalidChannelCount;

            if( !SampleFormatIsValid( inputParameters->sampleFormat ) )
                return paSampleFormatNotSupported;

            if( inputParameters->hostApiSpecificStreamInfo != NULL )
            {
                if( ((PaUtilHostApiSpecificStreamInfoHeader*)inputParameters->hostApiSpecificStreamInfo)->hostApiType
                        != (*hostApi)->info.type )
                    return paIncompatibleHostApiSpecificStreamInfo;
            }
        }

        if( outputParameters == NULL )
        {
            *hostApiOutputDevice = paNoDevice;
        }
        else if( outputParameters->device == paUseHostApiSpecificDeviceSpecification  )
        {
            if( outputParameters->hostApiSpecificStreamInfo )
            {
                outputHostApiIndex = Pa_HostApiTypeIdToHostApiIndex(
                        ((PaUtilHostApiSpecificStreamInfoHeader*)outputParameters->hostApiSpecificStreamInfo)->hostApiType );

                if( outputHostApiIndex != -1 )
                {
                    *hostApiOutputDevice = paUseHostApiSpecificDeviceSpecification;
                    *hostApi = hostApis_[outputHostApiIndex];
                }
                else
                {
                    return paInvalidDevice;
                }
            }
            else
            {
                return paInvalidDevice;
            }
        }
        else
        {
            if( outputParameters->device < 0 || outputParameters->device >= deviceCount_ )
                return paInvalidDevice;

            outputHostApiIndex = FindHostApi( outputParameters->device, hostApiOutputDevice );
            if( outputHostApiIndex < 0 )
                return paInternalError;

            *hostApi = hostApis_[outputHostApiIndex];

            if( outputParameters->channelCount <= 0 )
                return paInvalidChannelCount;

            if( !SampleFormatIsValid( outputParameters->sampleFormat ) )
                return paSampleFormatNotSupported;

            if( outputParameters->hostApiSpecificStreamInfo != NULL )
            {
                if( ((PaUtilHostApiSpecificStreamInfoHeader*)outputParameters->hostApiSpecificStreamInfo)->hostApiType
                        != (*hostApi)->info.type )
                    return paIncompatibleHostApiSpecificStreamInfo;
            }
        }

        if( (inputParameters != NULL) && (outputParameters != NULL) )
        {
            /* ensure that both devices use the same API */
            if( inputHostApiIndex != outputHostApiIndex )
                return paBadIODeviceCombination;
        }
    }


    /* Check for absurd sample rates. */
    if( (sampleRate < 1000.0) || (sampleRate > 384000.0) )
        return paInvalidSampleRate;

    if( ((streamFlags & ~paPlatformSpecificFlags) & ~(paClipOff | paDitherOff | paNeverDropInput | paPrimeOutputBuffersUsingStreamCallback ) ) != 0 )
        return paInvalidFlag;

    if( streamFlags & paNeverDropInput )
    {
        /* must be a callback stream */
        if( !streamCallback )
             return paInvalidFlag;

        /* must be a full duplex stream */
        if( (inputParameters == NULL) || (outputParameters == NULL) )
            return paInvalidFlag;

        /* must use paFramesPerBufferUnspecified */
        if( framesPerBuffer != paFramesPerBufferUnspecified )
            return paInvalidFlag;
    }

    return paNoError;
}